

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

void __thiscall VertexBuffer::VertexBuffer(VertexBuffer *this)

{
  VertexBuffer *this_local;
  
  BufferLayout::BufferLayout(&this->m_layout);
  init_buffer(this);
  return;
}

Assistant:

VertexBuffer::VertexBuffer()
{
    init_buffer();
}